

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

CURLcode Curl_pp_readresp(Curl_easy *data,curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  curl_off_t *pcVar1;
  char *__dest;
  char *__src;
  bool bVar2;
  _Bool _Var3;
  CURLcode CVar4;
  ulong uVar5;
  char *pcVar6;
  uint *puVar7;
  size_t sVar8;
  ulong uVar9;
  size_t size_00;
  ssize_t gotbytes;
  size_t local_50;
  curl_socket_t local_44;
  size_t *local_40;
  connectdata *local_38;
  
  local_38 = data->conn;
  __dest = (data->state).buffer;
  *code = 0;
  *size = 0;
  uVar9 = pp->nread_resp;
  uVar5 = (ulong)(data->set).buffer_size;
  CVar4 = CURLE_OK;
  if (uVar5 <= uVar9) {
LAB_005c9f9a:
    pp->pending_resp = false;
    return CVar4;
  }
  pcVar6 = __dest + uVar9;
  size_00 = (long)pcVar6 - (long)pp->linestart_resp;
  bVar2 = true;
  local_44 = sockfd;
  local_40 = size;
  do {
    if (pp->cache == (char *)0x0) {
      CVar4 = Curl_read(data,local_44,pcVar6,uVar5 - uVar9,(ssize_t *)&local_50);
      if (CVar4 != CURLE_OK) {
        if (CVar4 == CURLE_AGAIN) {
          return CURLE_OK;
        }
        goto LAB_005c9f9a;
      }
    }
    else {
      if (__dest + uVar5 + 1 < pcVar6 + pp->cache_size) {
        Curl_failf(data,"cached response data too big to handle");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      memcpy(pcVar6,pp->cache,pp->cache_size);
      local_50 = pp->cache_size;
      (*Curl_cfree)(pp->cache);
      pp->cache = (char *)0x0;
      pp->cache_size = 0;
    }
    if (bVar2) {
      if ((long)local_50 < 1) {
        puVar7 = (uint *)__errno_location();
        Curl_failf(data,"response reading failed (errno: %d)",(ulong)*puVar7);
        CVar4 = CURLE_RECV_ERROR;
        goto LAB_005c9f9a;
      }
      pcVar1 = &(data->req).headerbytecount;
      *pcVar1 = *pcVar1 + local_50;
      pp->nread_resp = pp->nread_resp + local_50;
      uVar9 = 0;
      sVar8 = local_50;
      do {
        size_00 = size_00 + 1;
        if (pcVar6[uVar9] == '\n') {
          Curl_debug(data,CURLINFO_HEADER_IN,pp->linestart_resp,size_00);
          CVar4 = Curl_client_write(data,2,pp->linestart_resp,size_00);
          if (CVar4 != CURLE_OK) {
            return CVar4;
          }
          _Var3 = (*pp->endofresp)(data,local_38,pp->linestart_resp,size_00,code);
          if (_Var3) {
            __src = pp->linestart_resp;
            memmove(__dest,__src,(size_t)(pcVar6 + (uVar9 - (long)__src)));
            __dest[(long)(pcVar6 + (uVar9 - (long)__src))] = '\0';
            pp->linestart_resp = pcVar6 + uVar9 + 1;
            *local_40 = pp->nread_resp;
            pp->nread_resp = 0;
            if (local_50 - 1 == uVar9) {
              bVar2 = false;
              goto LAB_005c9f29;
            }
            size_00 = ~uVar9 + local_50;
            bVar2 = false;
            goto LAB_005c9ef3;
          }
          pp->linestart_resp = pcVar6 + uVar9 + 1;
          size_00 = 0;
          sVar8 = local_50;
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)sVar8);
      uVar5 = (ulong)((data->set).buffer_size >> 1);
      if ((size_00 == sVar8) && ((long)uVar5 < (long)sVar8)) {
        Curl_infof(data,"Excessive server response line length received, %zd bytes. Stripping");
        size_00 = 0x28;
LAB_005c9efd:
        pp->cache_size = size_00;
        pcVar6 = (char *)(*Curl_cmalloc)(size_00);
        pp->cache = pcVar6;
        if (pcVar6 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        memcpy(pcVar6,pp->linestart_resp,pp->cache_size);
      }
      else {
        if (pp->nread_resp <= uVar5) {
          pcVar6 = pcVar6 + uVar9;
          goto LAB_005c9f3d;
        }
LAB_005c9ef3:
        if (size_00 != 0) goto LAB_005c9efd;
      }
LAB_005c9f29:
      pp->nread_resp = 0;
      pp->linestart_resp = __dest;
      size_00 = 0;
      pcVar6 = __dest;
    }
LAB_005c9f3d:
    uVar9 = pp->nread_resp;
    uVar5 = (ulong)(data->set).buffer_size;
    CVar4 = CURLE_OK;
    if ((uVar5 <= uVar9) || (CVar4 = CURLE_OK, !bVar2)) goto LAB_005c9f9a;
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  ssize_t perline; /* count bytes per line */
  bool keepon = TRUE;
  ssize_t gotbytes;
  char *ptr;
  struct connectdata *conn = data->conn;
  char * const buf = data->state.buffer;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  ptr = buf + pp->nread_resp;

  /* number of bytes in the current line, so far */
  perline = (ssize_t)(ptr-pp->linestart_resp);

  while((pp->nread_resp < (size_t)data->set.buffer_size) &&
        (keepon && !result)) {

    if(pp->cache) {
      /* we had data in the "cache", copy that instead of doing an actual
       * read
       *
       * pp->cache_size is cast to ssize_t here.  This should be safe, because
       * it would have been populated with something of size int to begin
       * with, even though its datatype may be larger than an int.
       */
      if((ptr + pp->cache_size) > (buf + data->set.buffer_size + 1)) {
        failf(data, "cached response data too big to handle");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      memcpy(ptr, pp->cache, pp->cache_size);
      gotbytes = (ssize_t)pp->cache_size;
      free(pp->cache);    /* free the cache */
      pp->cache = NULL;   /* clear the pointer */
      pp->cache_size = 0; /* zero the size just in case */
    }
    else {
#ifdef HAVE_GSSAPI
      enum protection_level prot = conn->data_prot;
      conn->data_prot = PROT_CLEAR;
#endif
      DEBUGASSERT((ptr + data->set.buffer_size - pp->nread_resp) <=
                  (buf + data->set.buffer_size + 1));
      result = Curl_read(data, sockfd, ptr,
                         data->set.buffer_size - pp->nread_resp,
                         &gotbytes);
#ifdef HAVE_GSSAPI
      DEBUGASSERT(prot  > PROT_NONE && prot < PROT_LAST);
      conn->data_prot = prot;
#endif
      if(result == CURLE_AGAIN)
        return CURLE_OK; /* return */

      if(result)
        /* Set outer result variable to this error. */
        keepon = FALSE;
    }

    if(!keepon)
      ;
    else if(gotbytes <= 0) {
      keepon = FALSE;
      result = CURLE_RECV_ERROR;
      failf(data, "response reading failed (errno: %d)", SOCKERRNO);
    }
    else {
      /* we got a whole chunk of data, which can be anything from one
       * byte to a set of lines and possible just a piece of the last
       * line */
      ssize_t i;
      ssize_t clipamount = 0;
      bool restart = FALSE;

      data->req.headerbytecount += (long)gotbytes;

      pp->nread_resp += gotbytes;
      for(i = 0; i < gotbytes; ptr++, i++) {
        perline++;
        if(*ptr == '\n') {
          /* a newline is CRLF in pp-talk, so the CR is ignored as
             the line isn't really terminated until the LF comes */

          /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
          if(!conn->sec_complete)
#endif
            Curl_debug(data, CURLINFO_HEADER_IN,
                       pp->linestart_resp, (size_t)perline);

          /*
           * We pass all response-lines to the callback function registered
           * for "headers". The response lines can be seen as a kind of
           * headers.
           */
          result = Curl_client_write(data, CLIENTWRITE_HEADER,
                                     pp->linestart_resp, perline);
          if(result)
            return result;

          if(pp->endofresp(data, conn, pp->linestart_resp, perline, code)) {
            /* This is the end of the last line, copy the last line to the
               start of the buffer and null-terminate, for old times sake */
            size_t n = ptr - pp->linestart_resp;
            memmove(buf, pp->linestart_resp, n);
            buf[n] = 0; /* null-terminate */
            keepon = FALSE;
            pp->linestart_resp = ptr + 1; /* advance pointer */
            i++; /* skip this before getting out */

            *size = pp->nread_resp; /* size of the response */
            pp->nread_resp = 0; /* restart */
            break;
          }
          perline = 0; /* line starts over here */
          pp->linestart_resp = ptr + 1;
        }
      }

      if(!keepon && (i != gotbytes)) {
        /* We found the end of the response lines, but we didn't parse the
           full chunk of data we have read from the server. We therefore need
           to store the rest of the data to be checked on the next invoke as
           it may actually contain another end of response already! */
        clipamount = gotbytes - i;
        restart = TRUE;
        DEBUGF(infof(data, "Curl_pp_readresp_ %d bytes of trailing "
                     "server response left",
                     (int)clipamount));
      }
      else if(keepon) {

        if((perline == gotbytes) &&
           (gotbytes > (ssize_t)data->set.buffer_size/2)) {
          /* We got an excessive line without newlines and we need to deal
             with it. We keep the first bytes of the line then we throw
             away the rest. */
          infof(data, "Excessive server response line length received, "
                "%zd bytes. Stripping", gotbytes);
          restart = TRUE;

          /* we keep 40 bytes since all our pingpong protocols are only
             interested in the first piece */
          clipamount = 40;
        }
        else if(pp->nread_resp > (size_t)data->set.buffer_size/2) {
          /* We got a large chunk of data and there's potentially still
             trailing data to take care of, so we put any such part in the
             "cache", clear the buffer to make space and restart. */
          clipamount = perline;
          restart = TRUE;
        }
      }
      else if(i == gotbytes)
        restart = TRUE;

      if(clipamount) {
        pp->cache_size = clipamount;
        pp->cache = malloc(pp->cache_size);
        if(pp->cache)
          memcpy(pp->cache, pp->linestart_resp, pp->cache_size);
        else
          return CURLE_OUT_OF_MEMORY;
      }
      if(restart) {
        /* now reset a few variables to start over nicely from the start of
           the big buffer */
        pp->nread_resp = 0; /* start over from scratch in the buffer */
        ptr = pp->linestart_resp = buf;
        perline = 0;
      }

    } /* there was data */

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}